

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

tuple<int,_int> __thiscall Net::login(Net *this,longlong room,string *pass)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  istream *piVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  undefined8 uVar11;
  ulong *in_RCX;
  string *psVar12;
  ulong *puVar13;
  long *plVar14;
  uint __len;
  int iVar15;
  string *__val;
  string temp;
  string reply;
  string request;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  replys;
  stringstream stream;
  value_type local_258;
  string local_238;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  char *local_1e0;
  string local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  __val = (string *)-(long)pass;
  if (0 < (long)pass) {
    __val = pass;
  }
  __len = 1;
  if ((string *)0x9 < __val) {
    psVar12 = __val;
    uVar5 = 4;
    do {
      __len = uVar5;
      if (psVar12 < (string *)0x64) {
        __len = __len - 2;
        goto LAB_00107c5c;
      }
      if (psVar12 < (string *)0x3e8) {
        __len = __len - 1;
        goto LAB_00107c5c;
      }
      if (psVar12 < (string *)0x2710) goto LAB_00107c5c;
      bVar4 = (string *)0x1869f < psVar12;
      psVar12 = (string *)((ulong)psVar12 / 10000);
      uVar5 = __len + 4;
    } while (bVar4);
    __len = __len + 1;
  }
LAB_00107c5c:
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_258,(char)__len - (char)((long)pass >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_258._M_dataplus._M_p + -((long)pass >> 0x3f),__len,(unsigned_long_long)__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x10b7d3);
  paVar1 = &local_238.field_2;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_238.field_2._M_allocated_capacity = *puVar13;
    local_238.field_2._8_8_ = plVar6[3];
    local_238._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_238.field_2._M_allocated_capacity = *puVar13;
    local_238._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_238._M_string_length = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
  plVar14 = plVar6 + 2;
  if ((long *)*plVar6 == plVar14) {
    local_1a8 = *plVar14;
    lStack_1a0 = plVar6[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar14;
    local_1b8 = (long *)*plVar6;
  }
  local_1b0 = plVar6[1];
  *plVar6 = (long)plVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_1b8,*in_RCX);
  local_218 = &local_208;
  plVar14 = plVar6 + 2;
  if ((long *)*plVar6 == plVar14) {
    local_208 = *plVar14;
    lStack_200 = plVar6[3];
  }
  else {
    local_208 = *plVar14;
    local_218 = (long *)*plVar6;
  }
  local_210 = plVar6[1];
  *plVar6 = (long)plVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity =
       local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_218,local_210 + (long)local_218);
  send_with_retry((Net *)room,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (*(int *)room == 0) {
    read_with_retry((Net *)room,&local_238);
    if (*(int *)room == 0) {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&local_1b8,(string *)&local_238,_S_out|_S_in);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while( true ) {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_1b8,(string *)&local_258,' ');
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        if (local_258._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1f8,&local_258);
        }
      }
      lVar8 = std::__cxx11::string::find
                        ((char *)local_1f8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0x10b7da,0);
      if (lVar8 == -1) {
        *(undefined4 *)room = 1;
        lVar10 = 0xffffffff;
        lVar8 = 0xffffffff;
LAB_00108015:
        this->closed = (int)lVar10;
        this->ready = (int)lVar8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_138);
        goto LAB_00107e63;
      }
      pcVar3 = local_1f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar9 = __errno_location();
      iVar2 = *piVar9;
      *piVar9 = 0;
      lVar8 = strtol(pcVar3,&local_1e0,10);
      if (local_1e0 == pcVar3) {
        std::__throw_invalid_argument("stoi");
LAB_00108070:
        std::__throw_out_of_range("stoi");
      }
      else {
        if (((int)lVar8 != lVar8) || (iVar15 = *piVar9, iVar15 == 0x22)) goto LAB_00108070;
        if (iVar15 == 0) {
          *piVar9 = iVar2;
          iVar15 = iVar2;
        }
        pcVar3 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        *piVar9 = 0;
        lVar10 = strtol(pcVar3,&local_1e0,10);
        if (local_1e0 != pcVar3) {
          if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar9 == 0x22)) goto LAB_00108088;
          if (*piVar9 == 0) {
            *piVar9 = iVar15;
          }
          goto LAB_00108015;
        }
      }
      std::__throw_invalid_argument("stoi");
LAB_00108088:
      uVar11 = std::__throw_out_of_range("stoi");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (local_218 != &local_208) {
        operator_delete(local_218);
      }
      _Unwind_Resume(uVar11);
    }
  }
  this->closed = -1;
  this->ready = -1;
LAB_00107e63:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int,int> Net::login(long long room,std::string pass){
	std::string request="LOGIN "+std::to_string(room)+" PASSWORD "+pass;
	std::string reply;
	send_with_retry(request);
	if(closed)return std::make_tuple<int,int>(-1,-1);
	read_with_retry(reply);
	if(closed)return std::make_tuple<int,int>(-1,-1);

	std::stringstream stream(reply);
	std::string temp;
	std::vector<std::string> replys;
	while(std::getline(stream,temp,' ')){
		if(!temp.empty()){
			replys.push_back(temp);
		}
	}
	if(replys[0].find("SUCCESS")!=std::string::npos){
		return std::make_tuple<int,int>(std::stoi(replys[1]),std::stoi(replys[2]));
	}
	closed=1;
	return std::make_tuple<int,int>(-1,-1);
}